

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int set_key_frame(AV1_COMP *cpi,uint frame_flags)

{
  SVC *svc;
  AV1_COMMON *cm;
  RATE_CONTROL *rc;
  uint frame_flags_local;
  AV1_COMP *cpi_local;
  int local_4;
  
  if ((cpi->common).current_frame.frame_number == 0) {
    local_4 = 1;
  }
  else if ((frame_flags & 1) == 0) {
    if (cpi->ppi->use_svc == 0) {
      if ((((cpi->oxcf).kf_cfg.auto_key & 1U) != 0) && ((cpi->rc).frames_to_key == 0)) {
        return 1;
      }
    }
    else if ((((cpi->svc).spatial_layer_id == 0) && (((cpi->oxcf).kf_cfg.auto_key & 1U) != 0)) &&
            (((cpi->oxcf).kf_cfg.key_freq_max == 0 ||
             ((cpi->svc).current_superframe % (uint)(cpi->oxcf).kf_cfg.key_freq_max == 0)))) {
      return 1;
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int set_key_frame(AV1_COMP *cpi, unsigned int frame_flags) {
  RATE_CONTROL *const rc = &cpi->rc;
  AV1_COMMON *const cm = &cpi->common;
  SVC *const svc = &cpi->svc;

  // Very first frame has to be key frame.
  if (cm->current_frame.frame_number == 0) return 1;
  // Set key frame if forced by frame flags.
  if (frame_flags & FRAMEFLAGS_KEY) return 1;
  if (!cpi->ppi->use_svc) {
    // Non-SVC
    if (cpi->oxcf.kf_cfg.auto_key && rc->frames_to_key == 0) return 1;
  } else {
    // SVC
    if (svc->spatial_layer_id == 0 &&
        (cpi->oxcf.kf_cfg.auto_key &&
         (cpi->oxcf.kf_cfg.key_freq_max == 0 ||
          svc->current_superframe % cpi->oxcf.kf_cfg.key_freq_max == 0)))
      return 1;
  }

  return 0;
}